

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationFastLatinBuilder::encodeCharCEs
          (CollationFastLatinBuilder *this,UErrorCode *errorCode)

{
  int64_t ce_00;
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  UnicodeString *this_00;
  uint32_t local_3c;
  int32_t expansionIndex;
  uint32_t miniCE;
  int64_t ce;
  int32_t i_1;
  int32_t indexBase;
  int32_t i;
  int32_t miniCEsStart;
  UErrorCode *errorCode_local;
  CollationFastLatinBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    iVar2 = UnicodeString::length(&this->result);
    for (i_1 = 0; i_1 < 0x1c0; i_1 = i_1 + 1) {
      UnicodeString::append(&this->result,L'\0');
    }
    iVar3 = UnicodeString::length(&this->result);
    for (ce._0_4_ = 0; (int)ce < 0x1c0; ce._0_4_ = (int)ce + 1) {
      ce_00 = this->charCEs[(int)ce][0];
      UVar1 = isContractionCharCE(ce_00);
      if (UVar1 == '\0') {
        local_3c = encodeTwoCEs(this,ce_00,this->charCEs[(int)ce][1]);
        if (0xffff < local_3c) {
          iVar4 = UnicodeString::length(&this->result);
          if (iVar4 - iVar3 < 0x400) {
            this_00 = UnicodeString::append(&this->result,(char16_t)(local_3c >> 0x10));
            UnicodeString::append(this_00,(char16_t)local_3c);
            local_3c = iVar4 - iVar3 | 0x800;
          }
          else {
            local_3c = 1;
          }
        }
        UnicodeString::setCharAt(&this->result,iVar2 + (int)ce,(UChar)local_3c);
      }
    }
    this_local._7_1_ = ::U_SUCCESS(*errorCode);
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationFastLatinBuilder::encodeCharCEs(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    int32_t miniCEsStart = result.length();
    for(int32_t i = 0; i < CollationFastLatin::NUM_FAST_CHARS; ++i) {
        result.append((UChar)0);  // initialize to completely ignorable
    }
    int32_t indexBase = result.length();
    for(int32_t i = 0; i < CollationFastLatin::NUM_FAST_CHARS; ++i) {
        int64_t ce = charCEs[i][0];
        if(isContractionCharCE(ce)) { continue; }  // defer contraction
        uint32_t miniCE = encodeTwoCEs(ce, charCEs[i][1]);
        if(miniCE > 0xffff) {
            // Note: There is a chance that this new expansion is the same as a previous one,
            // and if so, then we could reuse the other expansion.
            // However, that seems unlikely.
            int32_t expansionIndex = result.length() - indexBase;
            if(expansionIndex > (int32_t)CollationFastLatin::INDEX_MASK) {
                miniCE = CollationFastLatin::BAIL_OUT;
            } else {
                result.append((UChar)(miniCE >> 16)).append((UChar)miniCE);
                miniCE = CollationFastLatin::EXPANSION | expansionIndex;
            }
        }
        result.setCharAt(miniCEsStart + i, (UChar)miniCE);
    }
    return U_SUCCESS(errorCode);
}